

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
pegmatite::Context::parse_rule(Context *this,Rule *r,offset_in_Context_to_subr parse_func)

{
  pointer *ppRVar1;
  unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
  *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  iterator __position;
  undefined8 *puVar4;
  undefined8 uVar5;
  _Hash_node_base *p_Var6;
  __buckets_ptr pp_Var7;
  long lVar8;
  pointer pPVar9;
  Input *pIVar10;
  Index IVar11;
  Index IVar12;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *pvVar13;
  _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  uint uVar14;
  __node_ptr p_Var15;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  __first;
  undefined8 *puVar16;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var17;
  long in_RCX;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  _Var18;
  ulong uVar19;
  size_type __n;
  byte bVar20;
  Rule *pRVar21;
  _Hash_node_base _Var22;
  size_t sVar23;
  vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
  *this_02;
  ulong uVar24;
  undefined1 auVar25 [16];
  __buckets_alloc_type __alloc;
  CacheKey k;
  RuleState local_98;
  MatchMode local_84;
  Rule *local_80;
  ulong local_78;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *local_70;
  size_t local_68;
  _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  ParserPosition *local_58;
  ulong local_50;
  key_type local_48;
  
  local_48.rule = r;
  local_70 = std::__detail::
             _Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->rule_states,&local_48.rule);
  __position._M_current =
       (local_70->
       super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((local_70->
      super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
      )._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
    local_68 = 0xffffffffffffffff;
    local_84 = PARSE;
  }
  else {
    local_68 = __position._M_current[-1].position;
    local_84 = __position._M_current[-1].mode;
  }
  local_58 = &this->position;
  sVar23 = (this->position).it.idx - (this->start).idx;
  local_48.start.buffer = (this->position).it.buffer;
  local_48.start.idx = (this->position).it.idx;
  this_00 = &this->cache;
  uVar24 = local_48.start.idx * 2 ^ (ulong)r;
  uVar19 = uVar24 % (this->cache)._M_h._M_bucket_count;
  local_48.rule = r;
  p_Var15 = std::
            _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_node(&this_00->_M_h,uVar19,&local_48,uVar24);
  pvVar13 = local_70;
  if (p_Var15 != (__node_ptr)0x0) {
    uVar24 = *(long *)((long)&(p_Var15->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x38) -
             *(long *)((long)&(p_Var15->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x30);
    __first._M_current =
         std::
         _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ::_M_allocate((_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                        *)(((long)uVar24 >> 3) * 0x6db6db6db6db6db7),uVar19);
    puVar4 = *(undefined8 **)
              ((long)&(p_Var15->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x38);
    _Var18._M_current = __first._M_current;
    for (puVar16 = *(undefined8 **)
                    ((long)&(p_Var15->
                            super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                            ._M_storage._M_storage + 0x30); puVar16 != puVar4; puVar16 = puVar16 + 7
        ) {
      uVar5 = puVar16[6];
      ((_Var18._M_current)->source).finish.line = (int)uVar5;
      ((_Var18._M_current)->source).finish.col = (int)((ulong)uVar5 >> 0x20);
      pRVar21 = (Rule *)*puVar16;
      pIVar10 = (Input *)puVar16[1];
      IVar11 = puVar16[2];
      uVar5 = puVar16[3];
      IVar12 = puVar16[5];
      ((_Var18._M_current)->source).finish.it.buffer = (Input *)puVar16[4];
      ((_Var18._M_current)->source).finish.it.idx = IVar12;
      ((_Var18._M_current)->source).start.it.idx = IVar11;
      ((_Var18._M_current)->source).start.line = (int)uVar5;
      ((_Var18._M_current)->source).start.col = (int)((ulong)uVar5 >> 0x20);
      (_Var18._M_current)->matched_rule = pRVar21;
      ((_Var18._M_current)->source).start.it.buffer = pIVar10;
      _Var18._M_current = _Var18._M_current + 1;
    }
    std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
    ::
    insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
              ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                *)&this->matches,
               (this->matches).
               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish,__first,_Var18);
    uVar5 = *(undefined8 *)
             ((long)&(p_Var15->
                     super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                     ._M_storage._M_storage + 0x28);
    local_58->line = (int)uVar5;
    local_58->col = (int)((ulong)uVar5 >> 0x20);
    IVar11 = *(Index *)((long)&(p_Var15->
                               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                               ._M_storage._M_storage + 0x20);
    (local_58->it).buffer =
         *(Input **)
          ((long)&(p_Var15->
                  super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                  ._M_storage._M_storage + 0x18);
    (local_58->it).idx = IVar11;
    bVar20 = 1;
    if (__first._M_current != (ParseMatch *)0x0) {
      operator_delete(__first._M_current,uVar24);
    }
    goto LAB_00129296;
  }
  local_50 = (long)(this->matches).
                   super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matches).
                   super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_80 = r;
  local_78 = uVar24;
  local_60 = &this_00->_M_h;
  if (local_84 == REJECT) {
    if (sVar23 != local_68) {
      local_98.mode = PARSE;
      if (__position._M_current ==
          (local_70->
          super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_98.position = sVar23;
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        _M_realloc_insert<pegmatite::Context::RuleState>(local_70,__position,&local_98);
      }
      else {
        (__position._M_current)->position = sVar23;
        *(ulong *)&(__position._M_current)->mode = (ulong)(uint)local_98._12_4_ << 0x20;
        ppRVar1 = &(local_70->
                   super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
        local_98.position = sVar23;
      }
      r = local_80;
      if ((parse_func & 1) != 0) {
        parse_func = *(undefined8 *)
                      (*(long *)((long)&this->whitespace_rule + in_RCX) + -1 + parse_func);
      }
      goto LAB_00129021;
    }
    pRVar21 = (Rule *)0x0;
  }
  else {
    pRVar21 = r;
    if (local_84 == PARSE) {
      local_98.mode = (MatchMode)(sVar23 == local_68);
      if (__position._M_current ==
          (local_70->
          super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_98.position = sVar23;
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        _M_realloc_insert<pegmatite::Context::RuleState>(local_70,__position,&local_98);
      }
      else {
        (__position._M_current)->position = sVar23;
        *(ulong *)&(__position._M_current)->mode = CONCAT44(local_98._12_4_,local_98.mode);
        ppRVar1 = &(local_70->
                   super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
        local_98.position = sVar23;
      }
      if ((parse_func & 1) != 0) {
        parse_func = *(undefined8 *)
                      (*(long *)((long)&this->whitespace_rule + in_RCX) + -1 + parse_func);
      }
LAB_00129021:
      uVar14 = (*(code *)parse_func)((long)&this->whitespace_rule + in_RCX,r);
      pRVar21 = (Rule *)(ulong)uVar14;
      ppRVar1 = &(pvVar13->
                 super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + -1;
    }
  }
  this_01 = local_60;
  bVar20 = (byte)pRVar21;
  if (((ulong)pRVar21 & 1) != 0) {
    if (0x100 < (this->cache)._M_h._M_element_count) {
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(local_60);
    }
    uVar19 = local_78 % (this->cache)._M_h._M_bucket_count;
    p_Var15 = std::
              _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_node(this_01,uVar19,&local_48,local_78);
    if (p_Var15 == (__node_ptr)0x0) {
      p_Var15 = (__node_ptr)operator_new(0x58);
      (p_Var15->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      (p_Var15->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
      ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)local_48.rule;
      *(Input **)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 8) = local_48.start.buffer;
      *(Index *)((long)&(p_Var15->
                        super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                        ._M_storage._M_storage + 0x10) = local_48.start.idx;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x20) = 0xffffffffffffffff;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x30) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x38) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x40) = 0;
      auVar25 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->cache)._M_h._M_rehash_policy,
                           (this->cache)._M_h._M_bucket_count,(this->cache)._M_h._M_element_count);
      __n = auVar25._8_8_;
      if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (__n == 1) {
          __s = &(this->cache)._M_h._M_single_bucket;
          (this->cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_98,__n,
                           (void *)0x0);
          memset(__s,0,__n * 8);
        }
        _Var22._M_nxt = (this->cache)._M_h._M_before_begin._M_nxt;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if (_Var22._M_nxt != (_Hash_node_base *)0x0) {
          p_Var2 = &(this->cache)._M_h._M_before_begin;
          uVar19 = 0;
          do {
            p_Var6 = (_Var22._M_nxt)->_M_nxt;
            uVar24 = (ulong)_Var22._M_nxt[10]._M_nxt % __n;
            if (__s[uVar24] == (_Hash_node_base *)0x0) {
              (_Var22._M_nxt)->_M_nxt = p_Var2->_M_nxt;
              p_Var2->_M_nxt = _Var22._M_nxt;
              __s[uVar24] = p_Var2;
              if ((_Var22._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                pp_Var17 = __s + uVar19;
                goto LAB_0012918c;
              }
            }
            else {
              (_Var22._M_nxt)->_M_nxt = __s[uVar24]->_M_nxt;
              pp_Var17 = &__s[uVar24]->_M_nxt;
              uVar24 = uVar19;
LAB_0012918c:
              *pp_Var17 = _Var22._M_nxt;
            }
            _Var22._M_nxt = p_Var6;
            uVar19 = uVar24;
          } while (p_Var6 != (_Hash_node_base *)0x0);
        }
        pp_Var7 = (this->cache)._M_h._M_buckets;
        if (&(this->cache)._M_h._M_single_bucket != pp_Var7) {
          operator_delete(pp_Var7,(this->cache)._M_h._M_bucket_count << 3);
        }
        (this->cache)._M_h._M_bucket_count = __n;
        (this->cache)._M_h._M_buckets = __s;
        uVar19 = local_78 % __n;
      }
      (p_Var15->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = local_78;
      pp_Var7 = local_60->_M_buckets;
      if (pp_Var7[uVar19] == (__node_base_ptr)0x0) {
        p_Var6 = (this->cache)._M_h._M_before_begin._M_nxt;
        (p_Var15->super__Hash_node_base)._M_nxt = p_Var6;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var15;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          pp_Var7[(ulong)p_Var6[10]._M_nxt % (this->cache)._M_h._M_bucket_count] =
               (__node_base_ptr)p_Var15;
        }
        local_60->_M_buckets[uVar19] = &(this->cache)._M_h._M_before_begin;
      }
      else {
        (p_Var15->super__Hash_node_base)._M_nxt = pp_Var7[uVar19]->_M_nxt;
        pp_Var7[uVar19]->_M_nxt = (_Hash_node_base *)p_Var15;
      }
      psVar3 = &(this->cache)._M_h._M_element_count;
      *psVar3 = *psVar3 + 1;
    }
    *(undefined8 *)
     ((long)&(p_Var15->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x28) = *(undefined8 *)&local_58->line;
    IVar11 = (local_58->it).idx;
    *(Input **)
     ((long)&(p_Var15->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x18) = (local_58->it).buffer;
    *(Index *)((long)&(p_Var15->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x20) = IVar11;
    lVar8 = *(long *)((long)&(p_Var15->
                             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                             ._M_storage._M_storage + 0x30);
    if (*(long *)((long)&(p_Var15->
                         super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                         ._M_storage._M_storage + 0x38) != lVar8) {
      *(long *)((long)&(p_Var15->
                       super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                       ._M_storage._M_storage + 0x38) = lVar8;
    }
    pPVar9 = (this->matches).
             super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var18._M_current =
         (this->matches).
         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_50 < (ulong)((long)_Var18._M_current - (long)pPVar9)) {
      this_02 = (vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                 *)((p_Var15->
                    super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                    ._M_storage._M_storage.__data + 0x30);
      std::
      vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>::
      insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
                (this_02,*(ParseMatch **)this_02,
                 (ParseMatch *)((long)&pPVar9->matched_rule + local_50),_Var18);
    }
  }
LAB_00129296:
  return (bool)(bVar20 & 1);
}

Assistant:

bool Context::parse_rule(const Rule &r, bool (Context::*parse_func)(const Rule &))
{
	// For each rule, we maintain a vector consisting of where it was last
	// encountered (in the input stream) and what the parsing mode was.
	auto &states = rule_states[std::addressof(r)];
	// If this is the first time that we've encountered this rule, then set the
	// last position and mode to values that will trigger a normal parse: We
	// can't be in left recursion if this is the first time that we've
	// encountered the rule.
	size_t last_pos = Input::npos;
	MatchMode last_mode = MatchMode::PARSE;
	if (!states.empty())
	{
		auto &last = states.back();
		last_pos = last.position;
		last_mode = last.mode;
	}
	// Return value (success or failure of parse)
	bool ok;

	// Compute the new position in the stream.  We're only tracking offsets to
	// detect left recursion, not storing iterators.
	size_t new_pos = position.it - start;

	// Check if we have left recursion.  We are in a left-recursive state if
	// the last time that we encountered this rule was at the same point in the
	// input.
	bool lr = new_pos == last_pos;

	// Look up the current rule and parser position in the cache to see if
	// we've been here before and successfully parsed the rule.
	CacheKey k = { std::addressof(r), position.it };
	auto cache_entry = cache.find(k);
	if (cache_entry != cache.end())
	{
		// If we have a cache entry then grab the list of matched rules and the
		// end parsing position from the cache and don't bother trying to apply
		// the rules again.
		auto cached_matches = cache_entry->second.second;
		matches.insert(matches.end(), cached_matches.begin(), cached_matches.end());
		position = cache_entry->second.first;
		return true;
	}

	size_t new_match_index = matches.size();

	switch (last_mode)
	{
		//normal parse
		case MatchMode::PARSE:
			if (lr)
			{
				//first try to parse the rule by rejecting it, so alternative
				//branches are examined
				states.push_back(RuleState(new_pos, MatchMode::REJECT));
				ok = (this->*parse_func)(r);
				states.pop_back();
				break;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
		case MatchMode::REJECT:
			if (lr)
			{
				ok = false;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
	}

	// If we successfully parsed the input, then cache the result.
	if (ok)
	{
		// To prevent the cache growing too large, if it starts to get quite
		// big, delete everything.  256is a mostly arbitrary number generated
		// by running a big(ish) parse with a few different values and finding
		// the place where the increase in memory didn't come with a noticeable
		// speedup.
		if (cache.size() > 256)
		{
			cache.clear();
		}
		// Insert the new cache entry
		auto &new_cache = cache[k];
		new_cache.first = position;
		auto &cached_matches = new_cache.second;
		cached_matches.clear();
		// If there some rules were matched, record them
		if (matches.size() > new_match_index)
		{
			const auto index =
				static_cast<Input::iterator::difference_type>(new_match_index);
			cached_matches.insert(cached_matches.begin(), matches.begin() +
					index, matches.end());
		}
	}

	return ok;
}